

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O2

tnt_iter * tnt_iter_init(tnt_iter *i)

{
  bool bVar1;
  
  bVar1 = i == (tnt_iter *)0x0;
  if ((bVar1) && (i = (tnt_iter *)tnt_mem_alloc(0xa8), i == (tnt_iter *)0x0)) {
    return (tnt_iter *)0x0;
  }
  memset(i,0,0xa8);
  i->alloc = (uint)bVar1;
  return i;
}

Assistant:

static struct tnt_iter *tnt_iter_init(struct tnt_iter *i) {
	int alloc = (i == NULL);
	if (alloc) {
		i = tnt_mem_alloc(sizeof(struct tnt_iter));
		if (i == NULL)
			return NULL;
	}
	memset(i, 0, sizeof(struct tnt_iter));
	i->status = TNT_ITER_OK;
	i->alloc = alloc;
	return i;
}